

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

bool __thiscall QRectF::contains(QRectF *this,QPointF *p)

{
  QPointF *in_RSI;
  double *in_RDI;
  qreal qVar1;
  qreal b;
  qreal t;
  qreal r;
  qreal l;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  local_20 = *in_RDI;
  local_28 = *in_RDI;
  if (0.0 < in_RDI[2] || in_RDI[2] == 0.0) {
    local_28 = in_RDI[2] + local_28;
  }
  else {
    local_20 = in_RDI[2] + local_20;
  }
  if ((local_20 == local_28) && (!NAN(local_20) && !NAN(local_28))) {
    return false;
  }
  qVar1 = QPointF::x(in_RSI);
  if ((qVar1 < local_20) || (qVar1 = QPointF::x(in_RSI), local_28 < qVar1)) {
    return false;
  }
  local_30 = in_RDI[1];
  local_38 = in_RDI[1];
  if (0.0 < in_RDI[3] || in_RDI[3] == 0.0) {
    local_38 = in_RDI[3] + local_38;
  }
  else {
    local_30 = in_RDI[3] + local_30;
  }
  if ((local_30 == local_38) && (!NAN(local_30) && !NAN(local_38))) {
    return false;
  }
  qVar1 = QPointF::y(in_RSI);
  if ((local_30 <= qVar1) && (qVar1 = QPointF::y(in_RSI), qVar1 <= local_38)) {
    return true;
  }
  return false;
}

Assistant:

bool QRectF::contains(const QPointF &p) const noexcept
{
    qreal l = xp;
    qreal r = xp;
    if (w < 0)
        l += w;
    else
        r += w;
    if (l == r) // null rect
        return false;

    if (p.x() < l || p.x() > r)
        return false;

    qreal t = yp;
    qreal b = yp;
    if (h < 0)
        t += h;
    else
        b += h;
    if (t == b) // null rect
        return false;

    if (p.y() < t || p.y() > b)
        return false;

    return true;
}